

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::PluralFormat::format
          (PluralFormat *this,Formattable *obj,UnicodeString *appendTo,FieldPosition *pos,
          UErrorCode *status)

{
  UBool UVar1;
  UnicodeString *pUVar2;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar1 = Formattable::isNumeric(obj);
    if (UVar1 != '\0') {
      pUVar2 = format(this,obj,(obj->fValue).fDouble,appendTo,pos,status);
      return pUVar2;
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return appendTo;
}

Assistant:

UnicodeString&
PluralFormat::format(const Formattable& obj,
                   UnicodeString& appendTo,
                   FieldPosition& pos,
                   UErrorCode& status) const
{
    if (U_FAILURE(status)) return appendTo;

    if (obj.isNumeric()) {
        return format(obj, obj.getDouble(), appendTo, pos, status);
    } else {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return appendTo;
    }
}